

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

char * nng_strerror(nng_err num)

{
  int local_18;
  int i;
  nng_err num_local;
  
  local_18 = 0;
  while( true ) {
    if (nni_errors[local_18].msg == (char *)0x0) {
      if ((num & NNG_ESYSERR) == NNG_OK) {
        if ((num & NNG_ETRANERR) == NNG_OK) {
          snprintf(nng_strerror::unknownerrbuf,0x20,"Unknown error #%d",(ulong)num);
          _i = nng_strerror::unknownerrbuf;
        }
        else {
          snprintf(nng_strerror::tranerrbuf,0x20,"Transport error #%d",(ulong)(num & ~NNG_ETRANERR))
          ;
          _i = nng_strerror::tranerrbuf;
        }
      }
      else {
        _i = nni_plat_strerror(num & ~NNG_ESYSERR);
      }
      return _i;
    }
    if (nni_errors[local_18].code == num) break;
    local_18 = local_18 + 1;
  }
  return nni_errors[local_18].msg;
}

Assistant:

const char *
nng_strerror(nng_err num)
{
	static char unknownerrbuf[32];
	for (int i = 0; nni_errors[i].msg != NULL; i++) {
		if (nni_errors[i].code == num) {
			return (nni_errors[i].msg);
		}
	}

	if (num & NNG_ESYSERR) {
		return (nni_plat_strerror(num & ~NNG_ESYSERR));
	}

	if (num & NNG_ETRANERR) {
		static char tranerrbuf[32];
		(void) snprintf(tranerrbuf, sizeof(tranerrbuf),
		    "Transport error #%d", num & ~NNG_ETRANERR);
		return (tranerrbuf);
	}

	(void) snprintf(
	    unknownerrbuf, sizeof(unknownerrbuf), "Unknown error #%d", num);
	return (unknownerrbuf);
}